

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamReader_p.cpp
# Opt level: O3

bool __thiscall
BamTools::Internal::BamReaderPrivate::SetRegion(BamReaderPrivate *this,BamRegion *region)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  long *plVar3;
  size_type *psVar4;
  string message;
  string bracError;
  string local_80;
  string local_60;
  string local_40;
  
  local_40._M_dataplus._M_p._0_4_ =
       (int)((ulong)((long)(this->m_references).
                           super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->m_references).
                          super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333;
  bVar2 = BamRandomAccessController::SetRegion
                    (&this->m_randomAccessController,region,(int *)&local_40);
  if (!bVar2) {
    BamRandomAccessController::GetErrorString_abi_cxx11_(&local_40,&this->m_randomAccessController);
    paVar1 = &local_80.field_2;
    local_80._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,"could not set region: \n\t","");
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_80,
                                CONCAT44(local_40._M_dataplus._M_p._4_4_,
                                         (int)local_40._M_dataplus._M_p));
    psVar4 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_60.field_2._M_allocated_capacity = *psVar4;
      local_60.field_2._8_8_ = plVar3[3];
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    }
    else {
      local_60.field_2._M_allocated_capacity = *psVar4;
      local_60._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_60._M_string_length = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    local_80._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"BamReader::SetRegion","");
    SetErrorString(this,&local_80,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_40._M_dataplus._M_p._4_4_,(int)local_40._M_dataplus._M_p) !=
        &local_40.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_40._M_dataplus._M_p._4_4_,(int)local_40._M_dataplus._M_p));
    }
  }
  return bVar2;
}

Assistant:

bool BamReaderPrivate::SetRegion(const BamRegion& region)
{

    if (m_randomAccessController.SetRegion(region, m_references.size()))
        return true;
    else {
        const std::string bracError = m_randomAccessController.GetErrorString();
        const std::string message = std::string("could not set region: \n\t") + bracError;
        SetErrorString("BamReader::SetRegion", message);
        return false;
    }
}